

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlEnumerationPtr xmlCopyEnumeration(xmlEnumerationPtr cur)

{
  _xmlEnumeration *p_Var1;
  xmlEnumerationPtr pxVar2;
  xmlEnumerationPtr pxVar3;
  xmlEnumerationPtr pxVar4;
  xmlEnumerationPtr pxVar5;
  _xmlEnumeration *p_Var6;
  
  pxVar4 = (xmlEnumerationPtr)0x0;
  pxVar5 = (xmlEnumerationPtr)0x0;
  do {
    if (cur == (xmlEnumerationPtr)0x0) {
      return pxVar4;
    }
    pxVar2 = xmlCreateEnumeration(cur->name);
    if (pxVar2 == (xmlEnumerationPtr)0x0) {
      p_Var6 = pxVar4;
      if (pxVar4 == (xmlEnumerationPtr)0x0) {
        return (xmlEnumerationPtr)0x0;
      }
      do {
        p_Var1 = p_Var6->next;
        (*xmlFree)(p_Var6->name);
        (*xmlFree)(p_Var6);
        p_Var6 = p_Var1;
      } while (p_Var1 != (_xmlEnumeration *)0x0);
    }
    else {
      pxVar3 = pxVar2;
      if (pxVar4 != (xmlEnumerationPtr)0x0) {
        pxVar5->next = pxVar2;
        pxVar3 = pxVar4;
      }
      cur = cur->next;
      pxVar4 = pxVar3;
      pxVar5 = pxVar2;
    }
  } while (pxVar2 != (xmlEnumerationPtr)0x0);
  return (xmlEnumerationPtr)0x0;
}

Assistant:

xmlEnumerationPtr
xmlCopyEnumeration(xmlEnumerationPtr cur) {
    xmlEnumerationPtr ret = NULL;
    xmlEnumerationPtr last = NULL;

    while (cur != NULL) {
        xmlEnumerationPtr copy = xmlCreateEnumeration(cur->name);

        if (copy == NULL) {
            xmlFreeEnumeration(ret);
            return(NULL);
        }

        if (ret == NULL) {
            ret = last = copy;
        } else {
            last->next = copy;
            last = copy;
        }

        cur = cur->next;
    }

    return(ret);
}